

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool ON_IsDuplicateKnotVector
               (int order,int cv_count,double *knot,double *other_knot,bool bIgnoreParameterization)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  double other_k;
  double k;
  ON_Interval other_dom;
  ON_Interval dom;
  int i;
  int knot_count;
  bool rc;
  bool bIgnoreParameterization_local;
  double *other_knot_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  bVar1 = false;
  if (((knot != (double *)0x0) && (bVar1 = false, other_knot != (double *)0x0)) &&
     (bVar1 = false, 1 < order)) {
    bVar1 = order <= cv_count;
  }
  if (bVar1) {
    iVar5 = ON_KnotCount(order,cv_count);
    if (bIgnoreParameterization) {
      ON_Interval::ON_Interval
                ((ON_Interval *)(other_dom.m_t + 1),knot[order + -2],knot[cv_count + -1]);
      ON_Interval::ON_Interval((ON_Interval *)&k,other_knot[order + -2],other_knot[cv_count + -1]);
      dom.m_t[1]._4_4_ = 0;
      while( true ) {
        bVar4 = false;
        if (dom.m_t[1]._4_4_ < iVar5) {
          bVar4 = bVar1;
        }
        if (bVar4 == false) break;
        dVar2 = ON_Interval::NormalizedParameterAt
                          ((ON_Interval *)(other_dom.m_t + 1),knot[dom.m_t[1]._4_4_]);
        dVar3 = ON_Interval::NormalizedParameterAt
                          ((ON_Interval *)(other_dom.m_t + 1),other_knot[dom.m_t[1]._4_4_]);
        bVar1 = ABS(dVar2 - dVar3) <= 2.3283064365386963e-10;
        dom.m_t[1]._4_4_ = dom.m_t[1]._4_4_ + 1;
      }
    }
    else {
      dom.m_t[1]._4_4_ = 0;
      while( true ) {
        bVar4 = false;
        if (dom.m_t[1]._4_4_ < iVar5) {
          bVar4 = bVar1;
        }
        if (bVar4 == false) break;
        bVar1 = knot[dom.m_t[1]._4_4_] == other_knot[dom.m_t[1]._4_4_];
        dom.m_t[1]._4_4_ = dom.m_t[1]._4_4_ + 1;
      }
    }
  }
  return bVar1;
}

Assistant:

static bool ON_IsDuplicateKnotVector( int order, int cv_count, 
               const double* knot, const double* other_knot,
               bool bIgnoreParameterization )
{
  bool rc = (    0 != knot 
              && 0 != other_knot 
              && order >= 2 
              && cv_count >= order);

  if (rc)
  {
    const int knot_count = ON_KnotCount( order, cv_count );
    int i;
    if ( bIgnoreParameterization )
    {
      const ON_Interval dom(knot[order-2],knot[cv_count-1]);
      const ON_Interval other_dom(other_knot[order-2],other_knot[cv_count-1]);
      double k, other_k;
      for ( i = 0; i < knot_count && rc; i++ )
      {
        k = dom.NormalizedParameterAt(knot[i]);
        other_k = dom.NormalizedParameterAt(other_knot[i]);
        rc = (fabs(k-other_k) <= ON_ZERO_TOLERANCE);
      }
    }
    else
    {
      for ( i = 0; i < knot_count && rc; i++ )
      {
        rc = (knot[i] == other_knot[i]);
      }
    }
  }
  return rc;
}